

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block-utils.h
# Opt level: O2

Expression * __thiscall
wasm::BlockUtils::simplifyToContents<wasm::Vacuum>
          (BlockUtils *this,Block *block,Vacuum *parent,bool allowTypeChange)

{
  Type left;
  bool bVar1;
  Expression **ppEVar2;
  long lVar3;
  Expression *pEVar4;
  undefined7 in_register_00000009;
  char *pcVar5;
  Nop *output;
  Name target;
  EffectAnalyzer local_190;
  
  pcVar5 = (char *)CONCAT71(in_register_00000009,allowTypeChange);
  lVar3 = *(long *)(this + 0x28);
  if (lVar3 == 1) {
    ppEVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                         (this + 0x20),0);
    target.super_IString.str._M_str = pcVar5;
    target.super_IString.str._M_len = *(size_t *)(this + 0x18);
    bVar1 = BranchUtils::BranchSeeker::has
                      ((BranchSeeker *)*ppEVar2,*(Expression **)(this + 0x10),target);
    if (!bVar1) {
      ppEVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (this + 0x20),0);
      pEVar4 = *ppEVar2;
      EffectAnalyzer::EffectAnalyzer
                (&local_190,
                 (PassOptions *)
                 ((block->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.
                  id + 0x30),
                 (Module *)
                 block[4].list.
                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                 usedElements,pEVar4);
      bVar1 = EffectAnalyzer::hasSideEffects(&local_190);
      EffectAnalyzer::~EffectAnalyzer(&local_190);
      left.id = (pEVar4->type).id;
      if (!bVar1 && left.id < 2) {
        local_190._0_8_ =
             block[4].list.
             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
        ;
        pEVar4 = Builder::replaceWithIdenticalType<wasm::Block>((Builder *)&local_190,(Block *)this)
        ;
        return pEVar4;
      }
      bVar1 = wasm::Type::isSubType(left,(Type)*(uintptr_t *)(this + 8));
      if (bVar1 || (char)parent != '\0') {
        return pEVar4;
      }
      if ((1 < *(ulong *)(this + 8)) && ((pEVar4->type).id == 1)) {
        return (Expression *)this;
      }
      __assert_fail("block->type.isConcrete() && singleton->type == Type::unreachable",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/block-utils.h"
                    ,0x36,
                    "Expression *wasm::BlockUtils::simplifyToContents(Block *, T *, bool) [T = wasm::Vacuum]"
                   );
    }
    lVar3 = *(long *)(this + 0x28);
  }
  if (lVar3 == 0) {
    *this = (BlockUtils)0x16;
    *(undefined8 *)(this + 8) = 0;
  }
  return (Expression *)this;
}

Assistant:

inline Expression*
simplifyToContents(Block* block, T* parent, bool allowTypeChange = false) {
  auto& list = block->list;
  if (list.size() == 1 &&
      !BranchUtils::BranchSeeker::has(list[0], block->name)) {
    // just one element. try to replace the block
    auto* singleton = list[0];
    auto sideEffects =
      EffectAnalyzer(parent->getPassOptions(), *parent->getModule(), singleton)
        .hasSideEffects();
    if (!sideEffects && !singleton->type.isConcrete()) {
      // no side effects, and singleton is not returning a value, so we can
      // throw away the block and its contents, basically
      return Builder(*parent->getModule()).replaceWithIdenticalType(block);
    } else if (Type::isSubType(singleton->type, block->type) ||
               allowTypeChange) {
      return singleton;
    } else {
      // (side effects +) type change, must be block with declared value but
      // inside is unreachable (if both concrete, must match, and since no name
      // on block, we can't be branched to, so if singleton is unreachable, so
      // is the block)
      assert(block->type.isConcrete() && singleton->type == Type::unreachable);
      // we could replace with unreachable, but would need to update all
      // the parent's types
    }
  } else if (list.size() == 0) {
    ExpressionManipulator::nop(block);
  }
  return block;
}